

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::Marray<unsigned_char,_std::allocator<unsigned_long>_>::Marray
          (Marray<unsigned_char,_std::allocator<unsigned_long>_> *this,uchar *value,
          CoordinateOrder *coordinateOrder,allocator_type *allocator)

{
  allocator_type *order;
  uchar *puVar1;
  allocator<unsigned_long> local_79;
  Geometry<std::allocator<unsigned_long>_> local_78;
  allocator<unsigned_char> local_29;
  allocator_type *local_28;
  allocator_type *allocator_local;
  CoordinateOrder *coordinateOrder_local;
  uchar *value_local;
  Marray<unsigned_char,_std::allocator<unsigned_long>_> *this_local;
  
  local_28 = allocator;
  allocator_local = (allocator_type *)coordinateOrder;
  coordinateOrder_local = (CoordinateOrder *)value;
  value_local = (uchar *)this;
  std::allocator<unsigned_char>::allocator(&local_29);
  View<unsigned_char,_false,_std::allocator<unsigned_long>_>::View
            (&this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>,&local_29);
  std::allocator<unsigned_char>::~allocator(&local_29);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)&this->field_0x40,local_28);
  puVar1 = __gnu_cxx::new_allocator<unsigned_char>::allocate
                     ((new_allocator<unsigned_char> *)&this->field_0x40,1,(void *)0x0);
  order = allocator_local;
  (this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).data_ = puVar1;
  *(this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).data_ =
       (char)*coordinateOrder_local;
  std::allocator<unsigned_long>::allocator<unsigned_char>(&local_79,local_28);
  marray_detail::Geometry<std::allocator<unsigned_long>_>::Geometry
            (&local_78,0,(CoordinateOrder *)order,1,true,&local_79);
  marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
            (&(this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_,
             &local_78);
  marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&local_78);
  std::allocator<unsigned_long>::~allocator(&local_79);
  testInvariant(this);
  return;
}

Assistant:

inline
Marray<T, A>::Marray
(
    const T& value,
    const CoordinateOrder& coordinateOrder,
    const allocator_type& allocator
) 
:   dataAllocator_(allocator)
{
    this->data_ = dataAllocator_.allocate(1);
    this->data_[0] = value;
    this->geometry_ = geometry_type(0, coordinateOrder, 1, true, allocator);
    testInvariant();
}